

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O1

unsigned_long __thiscall internalJSONNode::operator_cast_to_unsigned_long(internalJSONNode *this)

{
  byte bVar1;
  long *plVar2;
  ulong uVar3;
  internalJSONNode *piVar4;
  internalJSONNode *piVar5;
  internalJSONNode *piVar6;
  unsigned_long uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 local_78 [32];
  json_number local_58;
  undefined8 uStack_50;
  undefined1 local_40 [32];
  
  piVar4 = this;
  Fetch(this);
  bVar1 = this->_type;
  uVar7 = (unsigned_long)bVar1;
  if (bVar1 != 0) {
    if (bVar1 == 1) {
      piVar4 = (internalJSONNode *)(this->_string)._M_dataplus._M_p;
      dVar8 = atof((char *)piVar4);
      (this->_value)._number = dVar8;
    }
    else if (bVar1 == 3) {
      return (ulong)(this->_value)._bool;
    }
    if (jsonSingletonERROR_UNDEFINED::getValue[abi:cxx11]()::single == '\0') {
      operator_cast_to_unsigned_long(piVar4);
    }
    piVar4 = (internalJSONNode *)(local_78 + 0x10);
    local_78._0_8_ = piVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,jsonSingletonERROR_UNDEFINED::getValue[abi:cxx11]()::single,
               DAT_00126760 + jsonSingletonERROR_UNDEFINED::getValue[abi:cxx11]()::single);
    std::__cxx11::string::append(local_78);
    JSONDebug::_JSON_ASSERT(bVar1 == 2,(json_string *)local_78);
    piVar5 = (internalJSONNode *)local_78._0_8_;
    if ((internalJSONNode *)local_78._0_8_ != piVar4) {
      operator_delete((void *)local_78._0_8_);
    }
    local_58 = (this->_value)._number;
    if (jsonSingletonERROR_LOWER_RANGE::getValue[abi:cxx11]()::single == '\0') {
      operator_cast_to_unsigned_long(piVar5);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &this->_string,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   jsonSingletonERROR_LOWER_RANGE::getValue[abi:cxx11]()::single);
    plVar2 = (long *)std::__cxx11::string::append(local_40);
    piVar5 = (internalJSONNode *)(plVar2 + 2);
    if ((internalJSONNode *)*plVar2 == piVar5) {
      local_78._16_8_ = *(undefined8 *)piVar5;
      local_78._24_8_ = plVar2[3];
      local_78._0_8_ = piVar4;
    }
    else {
      local_78._16_8_ = *(undefined8 *)piVar5;
      local_78._0_8_ = (internalJSONNode *)*plVar2;
    }
    local_78._8_8_ = plVar2[1];
    *plVar2 = (long)piVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    JSONDebug::_JSON_ASSERT(0.0 < local_58,(json_string *)local_78);
    if ((internalJSONNode *)local_78._0_8_ != piVar4) {
      operator_delete((void *)local_78._0_8_);
    }
    piVar5 = (internalJSONNode *)(local_40 + 0x10);
    piVar6 = (internalJSONNode *)local_40._0_8_;
    if ((internalJSONNode *)local_40._0_8_ != piVar5) {
      operator_delete((void *)local_40._0_8_);
    }
    local_58 = (this->_value)._number;
    if (jsonSingletonERROR_UPPER_RANGE::getValue[abi:cxx11]()::single == '\0') {
      operator_cast_to_unsigned_long(piVar6);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &this->_string,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   jsonSingletonERROR_UPPER_RANGE::getValue[abi:cxx11]()::single);
    plVar2 = (long *)std::__cxx11::string::append(local_40);
    piVar6 = (internalJSONNode *)(plVar2 + 2);
    if ((internalJSONNode *)*plVar2 == piVar6) {
      local_78._16_8_ = *(undefined8 *)piVar6;
      local_78._24_8_ = plVar2[3];
      local_78._0_8_ = piVar4;
    }
    else {
      local_78._16_8_ = *(undefined8 *)piVar6;
      local_78._0_8_ = (internalJSONNode *)*plVar2;
    }
    local_78._8_8_ = plVar2[1];
    *plVar2 = (long)piVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    JSONDebug::_JSON_ASSERT(local_58 < 1.8446744073709552e+19,(json_string *)local_78);
    if ((internalJSONNode *)local_78._0_8_ != piVar4) {
      operator_delete((void *)local_78._0_8_);
    }
    if ((internalJSONNode *)local_40._0_8_ != piVar5) {
      operator_delete((void *)local_40._0_8_);
    }
    local_58 = (this->_value)._number;
    uStack_50 = 0;
    local_40._0_8_ = piVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"(unsigend long) will truncate ","");
    plVar2 = (long *)std::__cxx11::string::_M_append
                               (local_40,(ulong)(this->_string)._M_dataplus._M_p);
    uVar3 = (long)(local_58 - 9.223372036854776e+18) & (long)local_58 >> 0x3f | (long)local_58;
    auVar9._8_4_ = (int)(uVar3 >> 0x20);
    auVar9._0_8_ = uVar3;
    auVar9._12_4_ = 0x45300000;
    piVar6 = (internalJSONNode *)(plVar2 + 2);
    if ((internalJSONNode *)*plVar2 == piVar6) {
      local_78._16_8_ = *(undefined8 *)piVar6;
      local_78._24_8_ = plVar2[3];
      local_78._0_8_ = piVar4;
    }
    else {
      local_78._16_8_ = *(undefined8 *)piVar6;
      local_78._0_8_ = (internalJSONNode *)*plVar2;
    }
    local_78._8_8_ = plVar2[1];
    *plVar2 = (long)piVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    JSONDebug::_JSON_ASSERT
              ((bool)(-(local_58 ==
                       (auVar9._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) & 1),
               (json_string *)local_78);
    if ((internalJSONNode *)local_78._0_8_ != piVar4) {
      operator_delete((void *)local_78._0_8_);
    }
    if ((internalJSONNode *)local_40._0_8_ != piVar5) {
      operator_delete((void *)local_40._0_8_);
    }
    uVar3 = (ulong)(this->_value)._number;
    uVar7 = (long)((this->_value)._number - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
  }
  return uVar7;
}

Assistant:

internalJSONNode::operator unsigned long long() const json_nothrow
    #endif /*<- */
    {
	   Fetch();
	   #ifdef JSON_CASTABLE /*-> JSON_CASTABLE */
		  switch(type()){
			 case JSON_NULL:
				return 0;
			 case JSON_BOOL:
				return _value._bool ? 1 : 0;
			 case JSON_STRING:
				FetchNumber();
		  }
	   #endif /*<- */
	   #ifdef JSON_ISO_STRICT /*-> JSON_ISO_STRICT */
		  JSON_ASSERT(type() == JSON_NUMBER, json_global(ERROR_UNDEFINED) + JSON_TEXT("(unsigned long)"));
		  JSON_ASSERT(_value._number > 0, _string + json_global(ERROR_LOWER_RANGE) + JSON_TEXT("unsigned long"));
		  JSON_ASSERT(_value._number < ULONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("unsigned long"));
		  JSON_ASSERT(_value._number == (json_number)((unsigned long)_value._number), json_string(JSON_TEXT("(unsigend long) will truncate ")) + _string);
		  return (unsigned long)_value._number;
	   #else /*<- else */
		  JSON_ASSERT(type() == JSON_NUMBER, json_global(ERROR_UNDEFINED) + JSON_TEXT("(unsigned long long)"));
		  JSON_ASSERT(_value._number > 0, _string + json_global(ERROR_LOWER_RANGE) + JSON_TEXT("unsigned long long"));
		  #ifdef ULONG_LONG_MAX
			 JSON_ASSERT(_value._number < ULONG_LONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("unsigned long long"));
		  #elif defined(ULLONG_MAX)
			 JSON_ASSERT(_value._number < ULLONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("unsigned long long"));
		  #endif
		  JSON_ASSERT(_value._number == (json_number)((unsigned long long)_value._number), json_string(JSON_TEXT("(unsigned long long) will truncate ")) + _string);
		  return (unsigned long long)_value._number;
	   #endif /*<- */
    }